

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdfjob-c.cc
# Opt level: O2

int wrap_qpdfjob(qpdfjob_handle j,function<int_(_qpdfjob_handle_*)> *fn)

{
  int iVar1;
  
  iVar1 = std::function<int_(_qpdfjob_handle_*)>::operator()(fn,j);
  return iVar1;
}

Assistant:

static int
wrap_qpdfjob(qpdfjob_handle j, std::function<int(qpdfjob_handle j)> fn)
{
    try {
        return fn(j);
    } catch (std::exception& e) {
        *j->j.getLogger()->getError() << j->j.getMessagePrefix() << ": " << e.what() << "\n";
    }
    return QPDFJob::EXIT_ERROR;
}